

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::find_betas_approx_1
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  CoeffReturnType pdVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  double *in_RCX;
  double dVar4;
  VectorXd b4;
  VectorXd Rho_temp;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  int i;
  MatrixXd L_6x4;
  EigenBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffc98;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffffca0;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffca8;
  SolverBase<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>_>
  *in_stack_fffffffffffffcb0;
  int *in_stack_fffffffffffffcb8;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcd0;
  MatrixType *in_stack_fffffffffffffcd8;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffffce0;
  int local_44;
  
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
  for (local_44 = 0; local_44 < 6; local_44 = local_44 + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98,0x904a4c);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98,0x904a84);
    *pSVar2 = dVar4;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98,0x904abd);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98,0x904af6);
    *pSVar2 = dVar4;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98,0x904b2f);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98,0x904b65);
    *pSVar2 = dVar4;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98,0x904b9b);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98,0x904bcb);
    *pSVar2 = dVar4;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
             (uint)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,6,1,0,6,1>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98)
  ;
  Eigen::SolverBase<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,-1,-1,0,-1,-1>,2>>>::
  solve<Eigen::Matrix<double,_1,1,0,_1,1>>(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_1,_1,0,_1,_1>,2>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffca0,
             (EigenBase<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffc98);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98);
  if (0.0 <= *pSVar3) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98);
    dVar4 = sqrt(*pSVar3);
    *in_RCX = dVar4;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98);
    in_RCX[1] = *pSVar3 / *in_RCX;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98);
    in_RCX[2] = *pSVar3 / *in_RCX;
    in_stack_fffffffffffffca0 =
         (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                   ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                    in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98);
    in_RCX[3] = (double)(in_stack_fffffffffffffca0->
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                        ).m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        .m_storage.m_data / *in_RCX;
  }
  else {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98);
    dVar4 = sqrt(-*pSVar3);
    *in_RCX = dVar4;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98);
    in_RCX[1] = -*pSVar3 / *in_RCX;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98);
    in_RCX[2] = -*pSVar3 / *in_RCX;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffca0,(Index)in_stack_fffffffffffffc98);
    in_RCX[3] = -*pSVar3 / *in_RCX;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x904f1e);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x904f2b);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            (in_stack_fffffffffffffca0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x904f45);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::find_betas_approx_1(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double * betas)
{
  Eigen::MatrixXd L_6x4(6,4);

  for(int i = 0; i < 6; i++)
  {
    L_6x4(i,0) = L_6x10(i,0);
    L_6x4(i,1) = L_6x10(i,1);
    L_6x4(i,2) = L_6x10(i,3);
    L_6x4(i,3) = L_6x10(i,6);
  }

  Eigen::JacobiSVD<Eigen::MatrixXd> SVD(
      L_6x4,
      Eigen::ComputeFullV | Eigen::ComputeFullU);
  Eigen::VectorXd Rho_temp = Rho;
  Eigen::VectorXd b4 = SVD.solve(Rho_temp);

  if (b4[0] < 0)
  {
    betas[0] = sqrt(-b4[0]);
    betas[1] = -b4[1] / betas[0];
    betas[2] = -b4[2] / betas[0];
    betas[3] = -b4[3] / betas[0];
  }
  else
  {
    betas[0] = sqrt(b4[0]);
    betas[1] = b4[1] / betas[0];
    betas[2] = b4[2] / betas[0];
    betas[3] = b4[3] / betas[0];
  }
}